

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# painter.cpp
# Opt level: O2

void __thiscall
Painter::Painter(Painter *this,
                vector<std::shared_ptr<mmWaveBS>,_std::allocator<std::shared_ptr<mmWaveBS>_>_>
                *nodes)

{
  Dimensions *pDVar1;
  Document *this_00;
  string local_58 [32];
  double local_38;
  double dStack_30;
  allocator local_21;
  
  (this->m_objects).
  super__Vector_base<std::shared_ptr<draw_object>,_std::allocator<std::shared_ptr<draw_object>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_objects).
  super__Vector_base<std::shared_ptr<draw_object>,_std::allocator<std::shared_ptr<draw_object>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_objects).
  super__Vector_base<std::shared_ptr<draw_object>,_std::allocator<std::shared_ptr<draw_object>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_nodes = nodes;
  this->m_draw = false;
  this->m_stopThread = false;
  (this->m_draw_thread)._M_id._M_thread = 0;
  pDVar1 = (Dimensions *)operator_new(0x10);
  pDVar1->width = 100.0;
  pDVar1->height = 100.0;
  this->m_dimesnions = pDVar1;
  this_00 = (Document *)operator_new(0x70);
  std::__cxx11::string::string(local_58,"network.svg",&local_21);
  local_38 = this->m_dimesnions->width;
  dStack_30 = this->m_dimesnions->height;
  std::__cxx11::string::string((string *)this_00,local_58);
  (this_00->layout).dimensions.width = local_38;
  (this_00->layout).dimensions.height = dStack_30;
  (this_00->layout).scale = 1.0;
  (this_00->layout).origin = BottomLeft;
  (this_00->layout).origin_offset.x = 0.0;
  (this_00->layout).origin_offset.y = 0.0;
  (this_00->body_nodes_str)._M_dataplus._M_p = (pointer)&(this_00->body_nodes_str).field_2;
  (this_00->body_nodes_str)._M_string_length = 0;
  (this_00->body_nodes_str).field_2._M_local_buf[0] = '\0';
  this->m_doc = this_00;
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

Painter::Painter(std::vector<std::shared_ptr<mmWaveBS>>const &nodes)
:m_draw_thread(),
m_nodes(nodes)
{
// 	m_nodes = &nodes;
	m_dimesnions = new svg::Dimensions(100, 100);
	m_doc = new svg::Document("network.svg", svg::Layout(*m_dimesnions, svg::Layout::BottomLeft));
}